

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_map.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  reference ppVar3;
  ostream *poVar4;
  pointer ppVar5;
  _Self *p_Var6;
  size_type sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  cake_iterator<false> *this;
  undefined1 local_ca8 [8];
  iterator iter;
  _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c88;
  _Self next;
  _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c78;
  iterator it;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  e_1;
  iterator __end1_1;
  iterator __begin1_1;
  multimap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1_1;
  int local_c24;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c20;
  _Base_ptr local_bf8;
  int local_bec;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_be8;
  _Base_ptr local_bc0;
  int local_bb4;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_bb0;
  _Base_ptr local_b88;
  int local_b7c;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b78;
  undefined1 local_b50 [8];
  multimap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  lolz;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> e;
  undefined1 local_b00 [8];
  iterator __end1;
  iterator __begin1;
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  *__range1;
  string local_ac0 [39];
  allocator local_a99;
  string local_a98 [39];
  allocator local_a71;
  string local_a70 [55];
  allocator local_a39;
  string local_a38 [32];
  undefined1 local_a18 [8];
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  aDict;
  
  aDict._2564_4_ = 0;
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  ::skiplist((skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
              *)local_a18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a38,"hello",&local_a39);
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  ::insert((skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
            *)local_a18,10,
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a38);
  std::__cxx11::string::~string(local_a38);
  std::allocator<char>::~allocator((allocator<char> *)&local_a39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a70,"jello",&local_a71);
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  ::insert((skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
            *)local_a18,0x14,
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a70);
  std::__cxx11::string::~string(local_a70);
  std::allocator<char>::~allocator((allocator<char> *)&local_a71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a98,"yello",&local_a99);
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  ::insert((skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
            *)local_a18,0x14,
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a98);
  std::__cxx11::string::~string(local_a98);
  std::allocator<char>::~allocator((allocator<char> *)&local_a99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ac0,"fello",(allocator *)((long)&__range1 + 7));
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  ::insert((skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
            *)local_a18,0x28,
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ac0);
  std::__cxx11::string::~string(local_ac0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  operator<<((ostream *)&std::cout,
             (skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
              *)local_a18);
  std::operator<<((ostream *)&std::cout,"SKIPLIST:\n");
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  ::begin((iterator *)&__end1.node,
          (skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
           *)local_a18);
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  ::end((iterator *)local_b00,
        (skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
         *)local_a18);
  while( true ) {
    bVar1 = skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
            ::cake_iterator<false>::operator!=
                      ((cake_iterator<false> *)&__end1.node,(cake_iterator<false> *)local_b00);
    if (!bVar1) break;
    pbVar8 = skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
             ::cake_iterator<false>::operator*((cake_iterator<false> *)&__end1.node);
    std::__cxx11::string::string
              ((string *)&lolz._M_t._M_impl.super__Rb_tree_header._M_node_count,(string *)pbVar8);
    poVar4 = std::operator<<((ostream *)&std::cout,
                             (string *)&lolz._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string((string *)&lolz._M_t._M_impl.super__Rb_tree_header._M_node_count);
    skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
    ::cake_iterator<false>::operator++((cake_iterator<false> *)&__end1.node);
  }
  std::
  multimap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::multimap((multimap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_b50);
  local_b7c = 10;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[6],_true>(&local_b78,&local_b7c,(char (*) [6])"hello");
  local_b88 = (_Base_ptr)
              std::
              multimap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::insert((multimap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_b50,&local_b78);
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_b78);
  local_bb4 = 0x14;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[6],_true>(&local_bb0,&local_bb4,(char (*) [6])"jello");
  local_bc0 = (_Base_ptr)
              std::
              multimap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::insert((multimap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_b50,&local_bb0);
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_bb0);
  local_bec = 0x14;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[6],_true>(&local_be8,&local_bec,(char (*) [6])"yello");
  local_bf8 = (_Base_ptr)
              std::
              multimap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::insert((multimap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_b50,&local_be8);
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_be8);
  local_c24 = 0x28;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[6],_true>(&local_c20,&local_c24,(char (*) [6])"fello");
  std::
  multimap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::insert((multimap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_b50,&local_c20);
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_c20);
  std::operator<<((ostream *)&std::cout,"MULTISET:\n");
  __end1_1 = std::
             multimap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin((multimap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_b50);
  e_1._32_8_ = std::
               multimap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end((multimap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_b50);
  while( true ) {
    bVar1 = std::operator!=(&__end1_1,(_Self *)&e_1.field_0x20);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(&__end1_1);
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&it,ppVar3);
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,(int)it._M_node);
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = std::operator<<(poVar4,(string *)&e_1);
    std::operator<<(poVar4,"\n");
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&it);
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1_1);
  }
  std::operator<<((ostream *)&std::cout,"MULTISET:\n");
  next._M_node._4_4_ = 0x14;
  local_c78._M_node =
       (_Base_ptr)
       std::
       multimap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((multimap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_b50,(key_type *)((long)&next._M_node + 4));
  poVar4 = std::operator<<((ostream *)&std::cout,"Found: ");
  ppVar5 = std::
           _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->(&local_c78);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,ppVar5->first);
  poVar4 = std::operator<<(poVar4,":");
  ppVar5 = std::
           _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->(&local_c78);
  poVar4 = std::operator<<(poVar4,(string *)&ppVar5->second);
  std::operator<<(poVar4,"\n");
  p_Var6 = std::
           _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator++(&local_c78);
  local_c88._M_node = p_Var6->_M_node;
  poVar4 = std::operator<<((ostream *)&std::cout,"Next: ");
  ppVar5 = std::
           _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->(&local_c88);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,ppVar5->first);
  poVar4 = std::operator<<(poVar4,":");
  ppVar5 = std::
           _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->(&local_c88);
  poVar4 = std::operator<<(poVar4,(string *)&ppVar5->second);
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)&std::cout,"Count: ");
  iter.node._4_4_ = 0x14;
  sVar7 = std::
          multimap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count((multimap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_b50,(key_type *)((long)&iter.node + 4));
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar7);
  std::operator<<(poVar4,"\n");
  std::operator<<((ostream *)&std::cout,"SKIPLIST:\n");
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  ::find((iterator *)local_ca8,
         (skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
          *)local_a18,0x14);
  poVar4 = std::operator<<((ostream *)&std::cout,"Found: ");
  pbVar8 = skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
           ::cake_iterator<false>::operator*((cake_iterator<false> *)local_ca8);
  poVar4 = std::operator<<(poVar4,(string *)pbVar8);
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)&std::cout,"Next: ");
  this = skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
         ::cake_iterator<false>::operator++((cake_iterator<false> *)local_ca8);
  pbVar8 = skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
           ::cake_iterator<false>::operator*(this);
  poVar4 = std::operator<<(poVar4,(string *)pbVar8);
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)&std::cout,"Count: ");
  iVar2 = skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
          ::count((skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
                   *)local_a18,0x14);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  std::operator<<(poVar4,"\n");
  aDict._2564_4_ = 0;
  std::
  multimap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~multimap((multimap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_b50);
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  ::~skiplist((skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
               *)local_a18);
  return aDict._2564_4_;
}

Assistant:

int main() {
  skiplist<int, std::string> aDict;

  aDict.insert(10, "hello");
  aDict.insert(20, "jello");
  aDict.insert(20, "yello");
  aDict.insert(40, "fello");

  std::cout << aDict;

  // foundit(aDict, DictKey{10});
  // foundit(aDict, DictKey{20});
  // foundit(aDict, DictKey{30});
  std::cout << "SKIPLIST:\n";
  for(auto e: aDict)
    std::cout << e << "\n";

  // same operations on multiset
  std::multimap<int, std::string> lolz;
  lolz.insert({10, "hello"});
  lolz.insert({20, "jello"});
  lolz.insert({20, "yello"});
  lolz.insert({40, "fello"});

  std::cout << "MULTISET:\n";
  for(auto e: lolz)
    std::cout << e.first << ":" << e.second << "\n";

  // what about a find?
  // returns the first element inserted apparently
  std::cout << "MULTISET:\n";
  auto it = lolz.find(20);
  std::cout << "Found: " << it->first << ":" << it->second << "\n";
  auto next = ++it;
  std::cout << "Next: " << next->first << ":" << next->second << "\n";
  std::cout << "Count: " << lolz.count(20) << "\n";

  // now to repeat it with our data structure
  std::cout << "SKIPLIST:\n";
  auto iter = aDict.find(20);
  std::cout << "Found: " << *iter << "\n";
  std::cout << "Next: " << *++iter << "\n";
  std::cout << "Count: " << aDict.count(20) << "\n";

  return 0;
}